

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap_dump.h
# Opt level: O1

bool __thiscall
phmap::priv::
raw_hash_set<phmap::priv::FlatHashSetPolicy<unsigned_int>,_phmap::Hash<unsigned_int>,_phmap::EqualTo<unsigned_int>,_std::allocator<unsigned_int>_>
::phmap_load<phmap::BinaryInputArchive>
          (raw_hash_set<phmap::priv::FlatHashSetPolicy<unsigned_int>,_phmap::Hash<unsigned_int>,_phmap::EqualTo<unsigned_int>,_std::allocator<unsigned_int>_>
           *this,BinaryInputArchive *ar)

{
  size_t *psVar1;
  size_t new_capacity;
  char *__tmp;
  size_t version;
  raw_hash_set<phmap::priv::FlatHashSetPolicy<unsigned_int>,_phmap::Hash<unsigned_int>,_phmap::EqualTo<unsigned_int>,_std::allocator<unsigned_int>_>
  local_58;
  
  local_58.ctrl_ = this->ctrl_;
  this->ctrl_ = EmptyGroup<std::is_same<std::allocator<unsigned_int>,std::allocator<unsigned_int>>>()
                ::empty_group;
  local_58.slots_ = this->slots_;
  this->slots_ = (slot_type *)0x0;
  local_58.size_ = this->size_;
  this->size_ = 0;
  local_58.capacity_ = this->capacity_;
  this->capacity_ = 0;
  local_58.settings_.
  super__Tuple_impl<0UL,_unsigned_long,_phmap::Hash<unsigned_int>,_phmap::EqualTo<unsigned_int>,_std::allocator<unsigned_int>_>
  .super__Head_base<0UL,_unsigned_long,_false>._M_head_impl =
       (_Tuple_impl<0UL,_unsigned_long,_phmap::Hash<unsigned_int>,_phmap::EqualTo<unsigned_int>,_std::allocator<unsigned_int>_>
        )(this->settings_).
         super__Tuple_impl<0UL,_unsigned_long,_phmap::Hash<unsigned_int>,_phmap::EqualTo<unsigned_int>,_std::allocator<unsigned_int>_>
         .super__Head_base<0UL,_unsigned_long,_false>._M_head_impl;
  (this->settings_).
  super__Tuple_impl<0UL,_unsigned_long,_phmap::Hash<unsigned_int>,_phmap::EqualTo<unsigned_int>,_std::allocator<unsigned_int>_>
  .super__Head_base<0UL,_unsigned_long,_false>._M_head_impl = 0;
  destroy_slots(&local_58);
  psVar1 = &this->size_;
  local_58.ctrl_ = (ctrl_t *)0x0;
  std::istream::read((char *)ar->is_,(long)&local_58);
  if (local_58.ctrl_ < (ctrl_t *)0xfffffffffffffff5) {
    *psVar1 = (size_t)local_58.ctrl_;
  }
  else {
    std::istream::read((char *)ar->is_,(long)psVar1);
  }
  std::istream::read((char *)ar->is_,(long)&this->capacity_);
  new_capacity = this->capacity_;
  if (new_capacity != 0) {
    initialize_slots(this,new_capacity);
  }
  if (*psVar1 != 0) {
    std::istream::read((char *)ar->is_,(long)this->ctrl_);
    std::istream::read((char *)ar->is_,(long)this->slots_);
    if (local_58.ctrl_ < (ctrl_t *)0xfffffffffffffff5) {
      drop_deletes_without_resize(this);
    }
    else {
      std::istream::read((char *)ar->is_,(long)&this->settings_);
    }
  }
  return true;
}

Assistant:

bool raw_hash_set<Policy, Hash, Eq, Alloc>::phmap_load(InputArchive& ar) {
    static_assert(type_traits_internal::IsTriviallyCopyable<value_type>::value,
                    "value_type should be trivially copyable");
    raw_hash_set<Policy, Hash, Eq, Alloc>().swap(*this); // clear any existing content

    size_t version = 0;
    ar.loadBinary(&version, sizeof(size_t));
    if (version < s_version_base) {
        // we didn't store the version, version actually contains the size
        size_ = version;
    } else {
        ar.loadBinary(&size_, sizeof(size_t));
    }
    ar.loadBinary(&capacity_, sizeof(size_t));

    if (capacity_) {
        // allocate memory for ctrl_ and slots_
        initialize_slots(capacity_);
    }
    if (size_ == 0)
        return true;
    ar.loadBinary(ctrl_,  sizeof(ctrl_t) * (capacity_ + Group::kWidth + 1));
    ar.loadBinary(slots_, sizeof(slot_type) * capacity_);
    if (version >= s_version_base) {
        // growth_left should be restored after calling initialize_slots() which resets it.
        ar.loadBinary(&growth_left(), sizeof(size_t));
    } else {
       drop_deletes_without_resize();
    }
    return true;
}